

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  size_type sVar8;
  int iVar9;
  bool bVar10;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_110;
  AssertionResult local_b8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar4 = (info->macroName).m_start;
  sVar5 = (info->macroName).m_size;
  pcVar6 = (info->lineInfo).file;
  sVar7 = (info->lineInfo).line;
  sVar8 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar8;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar6;
  (this->m_lastAssertionInfo).lineInfo.line = sVar7;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar4;
  (this->m_lastAssertionInfo).macroName.m_size = sVar5;
  paVar1 = &local_110.message.field_2;
  local_110.message._M_string_length = 0;
  local_110.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_110.reconstructedExpression.field_2;
  local_110.reconstructedExpression._M_string_length = 0;
  local_110.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_110.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_110.lazyExpression.m_isNegated = false;
  local_110.message._M_dataplus._M_p = (pointer)paVar1;
  local_110.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  local_110.resultType = resultType;
  AssertionResult::AssertionResult(&local_b8,info,&local_110);
  assertionEnded(this,&local_b8);
  if ((((undefined1)local_b8.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_b8.m_info.resultDisposition & SuppressFail) == 0)) {
    iVar9 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[6])();
    reaction->shouldDebugBreak = SUB41(iVar9,0);
    uVar3 = (this->m_totals).assertions.failed;
    iVar9 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
    bVar10 = true;
    if (uVar3 < (ulong)(long)iVar9) {
      bVar10 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_b8.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.message._M_dataplus._M_p != &local_b8.m_resultData.message.field_2) {
    operator_delete(local_b8.m_resultData.message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }